

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_file(char *filename,uchar *image,uint w,uint h,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  undefined4 in_R9D;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_000001d4;
  uint in_stack_000001d8;
  uint in_stack_000001dc;
  uchar *in_stack_000001e0;
  size_t *in_stack_000001e8;
  uchar **in_stack_000001f0;
  uint in_stack_00000200;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  
  uVar1 = lodepng_encode_memory
                    (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,
                     in_stack_000001d8,in_stack_000001d4,in_stack_00000200);
  if (uVar1 == 0) {
    uVar1 = lodepng_save_file((uchar *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              (char *)CONCAT44(in_stack_ffffffffffffffbc,in_R9D));
  }
  lodepng_free((void *)0x10e576);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_file(const char* filename, const unsigned char* image, unsigned w, unsigned h,
                             LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, image, w, h, colortype, bitdepth);
  if(!error) error = lodepng_save_file(buffer, buffersize, filename);
  lodepng_free(buffer);
  return error;
}